

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O2

void pzshape::TPZShapePrism::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  long *plVar6;
  uint uVar7;
  bool bVar8;
  int iVar9;
  uint num;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  TPZFNMatrix<100,_double> *this;
  long lVar13;
  int xj;
  ulong uVar14;
  long row;
  int xj_2;
  int xj_1;
  long lVar15;
  int (*local_e98) [4];
  TPZVec<long> ids;
  REAL outval;
  TPZFMatrix<double> dphin_1;
  TPZFMatrix<double> phin_1;
  TPZManVector<double,_1> outvalvec;
  TPZFNMatrix<60,_double> dphin;
  TPZFNMatrix<60,_double> phin;
  TPZFNMatrix<100,_double> dphiblend;
  TPZFNMatrix<100,_double> phiblend;
  
  CornerShape(pt,phi,dphi);
  bVar8 = true;
  for (lVar11 = 0; lVar11 != 0xf; lVar11 = lVar11 + 1) {
    bVar8 = (bool)(bVar8 & order->fStore[lVar11] < 2);
  }
  if (!bVar8) {
    TPZFNMatrix<100,_double>::TPZFNMatrix(&phiblend,0x15,1);
    this = &dphiblend;
    TPZFNMatrix<100,_double>::TPZFNMatrix(this,3,0x15);
    for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
      pdVar10 = TPZFMatrix<double>::operator()(phi,lVar11,0);
      dVar1 = *pdVar10;
      this = &phiblend;
      pdVar10 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar11,0);
      *pdVar10 = dVar1;
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        pdVar10 = TPZFMatrix<double>::operator()(dphi,lVar13,lVar11);
        dVar1 = *pdVar10;
        this = &dphiblend;
        pdVar10 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar13,lVar11);
        *pdVar10 = dVar1;
      }
    }
    ShapeGenerating((TPZVec<double> *)this,&phiblend.super_TPZFMatrix<double>,
                    &dphiblend.super_TPZFMatrix<double>);
    lVar11 = 6;
    for (lVar13 = 0; lVar13 != 9; lVar13 = lVar13 + 1) {
      ProjectPoint3dPrismaToRib((int)lVar13,pt,&outval);
      TPZVec<long>::TPZVec(&ids,2);
      TPZManVector<double,_1>::TPZManVector(&outvalvec,1,&outval);
      iVar5 = pztopology::TPZPrism::SideNodes[lVar13][1];
      plVar6 = id->fStore;
      *ids.fStore = plVar6[pztopology::TPZPrism::SideNodes[lVar13][0]];
      ids.fStore[1] = plVar6[iVar5];
      uVar12 = (long)order->fStore[lVar13] - 1;
      TPZFMatrix<double>::TPZFMatrix(&phin_1,uVar12,1,(double *)&dphin,0x14);
      TPZFMatrix<double>::TPZFMatrix(&dphin_1,3,uVar12,(double *)&phin,0x3c);
      memset(phin_1.fElem,0,
             phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      memset(dphin_1.fElem,0,
             dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             CONCAT44(dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol._4_4_,
                      (uint)dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol) * 8);
      dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      iVar5 = order->fStore[lVar13];
      iVar9 = TPZShapeLinear::GetTransformId1d(&ids);
      TPZShapeLinear::ShapeInternal(&outvalvec.super_TPZVec<double>,iVar5,&phin_1,&dphin_1,iVar9);
      TransformDerivativeFromRibToPrisma((int)lVar13,(int)uVar12,&dphin_1);
      lVar15 = lVar13 + 6;
      lVar11 = (long)(int)lVar11;
      uVar14 = uVar12 & 0xffffffff;
      if ((int)uVar12 < 1) {
        uVar14 = 0;
      }
      for (uVar12 = 0; uVar12 != uVar14; uVar12 = uVar12 + 1) {
        pdVar10 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar15,0);
        dVar1 = *pdVar10;
        pdVar10 = TPZFMatrix<double>::operator()(&phin_1,uVar12,0);
        dVar2 = *pdVar10;
        pdVar10 = TPZFMatrix<double>::operator()(phi,lVar11,0);
        *pdVar10 = dVar1 * dVar2;
        for (row = 0; row != 3; row = row + 1) {
          pdVar10 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,row,lVar15);
          dVar1 = *pdVar10;
          pdVar10 = TPZFMatrix<double>::operator()(&phin_1,uVar12,0);
          dVar2 = *pdVar10;
          pdVar10 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar15,0);
          dVar3 = *pdVar10;
          pdVar10 = TPZFMatrix<double>::operator()(&dphin_1,row,uVar12);
          dVar4 = *pdVar10;
          pdVar10 = TPZFMatrix<double>::operator()(dphi,row,lVar11);
          *pdVar10 = dVar1 * dVar2 + dVar3 * dVar4;
        }
        lVar11 = lVar11 + 1;
      }
      TPZFMatrix<double>::~TPZFMatrix(&dphin_1);
      TPZFMatrix<double>::~TPZFMatrix(&phin_1);
      TPZManVector<double,_1>::~TPZManVector(&outvalvec);
      TPZVec<long>::~TPZVec(&ids);
    }
    local_e98 = pztopology::TPZPrism::FaceNodes;
    uVar12 = 0;
    while( true ) {
      if (uVar12 == 5) break;
      if (((uVar12 & 3) != 0) || (order->fStore[uVar12 + 9] != 2)) {
        TPZVec<double>::TPZVec((TPZVec<double> *)&ids,2);
        ProjectPoint3dPrismaToFace((int)uVar12,pt,(TPZVec<double> *)&ids);
        iVar5 = order->fStore[uVar12 + 9];
        if (((uVar12 & 3) != 0) || (2 < iVar5)) {
          if ((uVar12 & 3) == 0) {
            num = ((iVar5 + -1) * (iVar5 + -2)) / 2;
          }
          else {
            num = (iVar5 + -1) * (iVar5 + -1);
          }
          TPZFMatrix<double>::TPZFMatrix(&phin_1,(long)(int)num,1,(double *)&dphin,0x14);
          TPZFMatrix<double>::TPZFMatrix(&dphin_1,3,(long)(int)num,(double *)&phin,0x3c);
          memset(phin_1.fElem,0,
                 phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
          phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          memset(dphin_1.fElem,0,
                 dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 CONCAT44(dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol._4_4_,
                          (uint)dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol) * 8);
          dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TPZManVector<long,_10>::TPZManVector((TPZManVector<long,_10> *)&outvalvec,4);
          plVar6 = id->fStore;
          if ((uVar12 & 3) == 0) {
            for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
              outvalvec.super_TPZVec<double>.fStore[lVar13] = (double)plVar6[(*local_e98)[lVar13]];
            }
          }
          else {
            for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
              outvalvec.super_TPZVec<double>.fStore[lVar13] = (double)plVar6[(*local_e98)[lVar13]];
            }
          }
          if ((uVar12 & 3) == 0) {
            TPZManVector<long,_10>::Resize((TPZManVector<long,_10> *)&outvalvec,3);
            iVar9 = TPZShapeTriang::GetTransformId2dT((TPZVec<long> *)&outvalvec);
            *ids.fStore = (long)(((double)*ids.fStore + 1.0) * 0.5);
            ids.fStore[1] = (long)(((double)ids.fStore[1] + 1.0) * 0.5);
            TPZShapeTriang::ShapeInternal((TPZVec<double> *)&ids,iVar5 + -2,&phin_1,&dphin_1,iVar9);
            uVar7 = (uint)dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
            if ((int)(uint)dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1) {
              uVar7 = 0;
            }
            for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
              pdVar10 = TPZFMatrix<double>::operator()(&dphin_1,0,uVar14);
              *pdVar10 = *pdVar10 * 0.5;
              pdVar10 = TPZFMatrix<double>::operator()(&dphin_1,1,uVar14);
              *pdVar10 = *pdVar10 * 0.5;
            }
          }
          else {
            iVar9 = TPZShapeQuad::GetTransformId2dQ((TPZVec<long> *)&outvalvec);
            TPZShapeQuad::ShapeInternal((TPZVec<double> *)&ids,iVar5 + -2,&phin_1,&dphin_1,iVar9);
          }
          TransformDerivativeFromFaceToPrisma((int)uVar12,num,&dphin_1);
          lVar11 = (long)(int)lVar11;
          lVar13 = uVar12 + 0xf;
          if ((int)num < 1) {
            num = 0;
          }
          for (uVar14 = 0; uVar14 != num; uVar14 = uVar14 + 1) {
            pdVar10 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar13,0);
            dVar1 = *pdVar10;
            pdVar10 = TPZFMatrix<double>::operator()(&phin_1,uVar14,0);
            dVar2 = *pdVar10;
            pdVar10 = TPZFMatrix<double>::operator()(phi,lVar11,0);
            *pdVar10 = dVar1 * dVar2;
            for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
              pdVar10 = TPZFMatrix<double>::operator()
                                  (&dphiblend.super_TPZFMatrix<double>,lVar15,lVar13);
              dVar1 = *pdVar10;
              pdVar10 = TPZFMatrix<double>::operator()(&phin_1,uVar14,0);
              dVar2 = *pdVar10;
              pdVar10 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar13,0);
              dVar3 = *pdVar10;
              pdVar10 = TPZFMatrix<double>::operator()(&dphin_1,lVar15,uVar14);
              dVar4 = *pdVar10;
              pdVar10 = TPZFMatrix<double>::operator()(dphi,lVar15,lVar11);
              *pdVar10 = dVar1 * dVar2 + dVar3 * dVar4;
            }
            lVar11 = lVar11 + 1;
          }
          TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)&outvalvec);
          TPZFMatrix<double>::~TPZFMatrix(&dphin_1);
          TPZFMatrix<double>::~TPZFMatrix(&phin_1);
        }
        TPZVec<double>::~TPZVec((TPZVec<double> *)&ids);
      }
      uVar12 = uVar12 + 1;
      local_e98 = local_e98 + 1;
    }
    iVar5 = order->fStore[0xe];
    if (2 < iVar5) {
      uVar12 = (ulong)((uint)((iVar5 + -2) * (iVar5 + -1) * (iVar5 + -1)) >> 1);
      TPZFNMatrix<60,_double>::TPZFNMatrix(&phin,uVar12,1);
      TPZFNMatrix<60,_double>::TPZFNMatrix(&dphin,3,uVar12);
      memset(phin.super_TPZFMatrix<double>.fElem,0,
             phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      memset(dphin.super_TPZFMatrix<double>.fElem,0,
             dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      ShapeInternal(pt,order->fStore[0xe],&phin.super_TPZFMatrix<double>,
                    &dphin.super_TPZFMatrix<double>);
      lVar11 = (long)(int)lVar11;
      for (uVar14 = 0; uVar14 != uVar12; uVar14 = uVar14 + 1) {
        pdVar10 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,0x14,0);
        dVar1 = *pdVar10;
        pdVar10 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,uVar14,0);
        dVar2 = *pdVar10;
        pdVar10 = TPZFMatrix<double>::operator()(phi,lVar11,0);
        *pdVar10 = dVar1 * dVar2;
        for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
          pdVar10 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar13,0x14);
          dVar1 = *pdVar10;
          pdVar10 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,uVar14,0);
          dVar2 = *pdVar10;
          pdVar10 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,0x14,0);
          dVar3 = *pdVar10;
          pdVar10 = TPZFMatrix<double>::operator()(&dphin.super_TPZFMatrix<double>,lVar13,uVar14);
          dVar4 = *pdVar10;
          pdVar10 = TPZFMatrix<double>::operator()(dphi,lVar13,lVar11);
          *pdVar10 = dVar1 * dVar2 + dVar3 * dVar4;
        }
        lVar11 = lVar11 + 1;
      }
      TPZFNMatrix<60,_double>::~TPZFNMatrix(&dphin);
      TPZFNMatrix<60,_double>::~TPZFNMatrix(&phin);
    }
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphiblend);
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&phiblend);
  }
  return;
}

Assistant:

void TPZShapePrism::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
		for(is=NCornerNodes; is<NSides; is++) if(order[is-NCornerNodes] > 1) linear = false;
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		//  if(order[14]<2) return;//order tem as ordens dos lados do elemento
		int shape = 6;
		//rib shapes
		for (int rib = 0; rib < 9; rib++) {//todas as arestas
			REAL outval;
			ProjectPoint3dPrismaToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int nshape = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(nshape,1,store1,20),dphin(3,nshape,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToPrisma(rib,nshape,dphin);
			for (int i = 0; i < nshape; i++) {
				phi(shape,0) = phiblend(rib+6,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+6)  * phin( i, 0) +
					phiblend(rib+6, 0 )   * dphin(xj,i);
				}
				shape++;
			}
		}
		//  if(order[14]<2) return;//ordem do elemento
		//face shapes
		for (int face = 0; face < 5; face++) {
			
			if((face==0 || face==4) && order[face+9]==2) continue;//estas face nao tem shapes associadas com ordem p=2
			TPZVec<REAL> outval(2);
			ProjectPoint3dPrismaToFace(face,pt,outval);
			REAL store1[20],store2[60];
			int ord1;//,ord2;
			ord1 = order[face+9];
			//ord2 = ord1;
			//elpr->FaceOrder(face,ord1,ord2);//ordem da face
			if((face==0 || face==4) && ord1<3) continue;//uma face triangular com ordem < 3 n�o tem shape associada
			int ordin;
			if(face && face<4) ordin = (ord1-1)*(ord1-1);//faces quadrilaterais
			else ordin = (ord1-2)*(ord1-1)/2;//face triangular
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(4);
			//	int id0,id1,id2
			int i;
			if(face ==0 || face == 4) for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			else for(i=0;i<4;i++) ids[i] = id[FaceNodes[face][i]];
			//    id0 = ShapeFaceId[face][0];//indice das shapes da face x
			//    id1 = ShapeFaceId[face][1];//que compoem a shape atual
			//    id2 = ShapeFaceId[face][2];
			int transid;
			if(face && face<4) {
				transid = TPZShapeQuad::GetTransformId2dQ(ids);
				TPZShapeQuad::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			} else {
				ids.Resize(3);
				transid = TPZShapeTriang::GetTransformId2dT(ids);
				outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
				outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..) : correto aqui
				TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
				int c = dphin.Cols();//isto da (p-2)(p-1)/2 ; ord1 = p ; correto aqui
				for(i=0;i<c;i++) {
					dphin(0,i) /= 2.;//correcao da derivada OK! aqui
					dphin(1,i) /= 2.;
					//dphin(2,i) /= 2.;
				}
			}
			TransformDerivativeFromFaceToPrisma(face,ordin,dphin);//ordin = numero de shapes
			for(i=0;i<ordin;i++)	{
				phi(shape,0) = phiblend(face+15,0)*phin(i,0);//face quadril�teral
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+15) * phin(i ,0) +
					phiblend(face+15, 0) * dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[14]<3) return;
		//volume shapes
		int ord=0;
		ord = NConnectShapeF(20,order[20-NCornerNodes]);
		TPZFNMatrix<60> phin(ord,1),dphin(3,ord);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[14],phin,dphin);
		for(int i=0;i<ord;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1)* phin(i ,0) +
				phiblend(NSides-1, 0)* dphin(xj,i);
			}
			shape++;
		}
		
		//}//while
		
	}